

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

void Cec_ManSimCompareEqualScore(uint *p0,uint *p1,int nWords,int *pScores)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar1 = 0;
  if (0 < nWords) {
    uVar1 = (ulong)(uint)nWords;
  }
  uVar2 = 0;
  if (((*p1 ^ *p0) & 1) == 0) {
    for (; uVar2 != uVar1; uVar2 = uVar2 + 1) {
      if (p0[uVar2] != p1[uVar2]) {
        for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
          if (((p1[uVar2] ^ p0[uVar2]) >> ((uint)lVar3 & 0x1f) & 1) != 0) {
            pScores[(ulong)((uint)uVar2 & 0x7ffffff) * 0x20 + lVar3] =
                 pScores[(ulong)((uint)uVar2 & 0x7ffffff) * 0x20 + lVar3] + 1;
          }
        }
      }
    }
  }
  else {
    for (; uVar2 != uVar1; uVar2 = uVar2 + 1) {
      if ((p1[uVar2] ^ p0[uVar2]) != 0xffffffff) {
        for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
          if (((p1[uVar2] ^ p0[uVar2]) >> ((uint)lVar3 & 0x1f) & 1) == 0) {
            pScores[(ulong)((uint)uVar2 & 0x7ffffff) * 0x20 + lVar3] =
                 pScores[(ulong)((uint)uVar2 & 0x7ffffff) * 0x20 + lVar3] + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Cec_ManSimCompareEqualScore( unsigned * p0, unsigned * p1, int nWords, int * pScores )
{
    int w, b;
    if ( (p0[0] & 1) == (p1[0] & 1) )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != p1[w] )
                for ( b = 0; b < 32; b++ )
                    if ( ((p0[w] ^ p1[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p0[w] != ~p1[w] )
                for ( b = 0; b < 32; b++ )
                    if ( ((p0[w] ^ ~p1[w]) >> b ) & 1 )
                        pScores[32*w + b]++;
    }
}